

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
mpt::item<mpt::layout::graph::axis>::item(item<mpt::layout::graph::axis> *this,axis *ref)

{
  (this->super_reference<mpt::layout::graph::axis>)._ref = ref;
  identifier::identifier(&this->super_identifier,0x18);
  return;
}

Assistant:

item(T *ref = 0) : reference<T>(ref), identifier(sizeof(identifier) + sizeof(_post))
	{ }